

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate2<float>::apply
          (QGate2<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int qubit0;
  reference pvVar1;
  float *vector_00;
  SquareMatrix<float> local_98;
  undefined1 local_88 [8];
  anon_class_72_17_20e643c5 f;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<float,_std::allocator<float>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate2<float> *this_local;
  
  (*(this->super_QObject<float>)._vptr_QObject[5])();
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m43,0);
  *pvVar1 = *pvVar1 + offset;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m43,1);
  *pvVar1 = *pvVar1 + offset;
  (*(this->super_QObject<float>)._vptr_QObject[7])(&local_98);
  vector_00 = std::vector<float,_std::allocator<float>_>::data(vector);
  lambda_QGate2<float>((anon_class_72_17_20e643c5 *)local_88,op,&local_98,vector_00);
  dense::SquareMatrix<float>::~SquareMatrix(&local_98);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m43,0);
  qubit0 = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m43,1);
  apply4<qclab::qgates::lambda_QGate2<float>(qclab::Op,qclab::dense::SquareMatrix<float>,float*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,qubit0,*pvVar1,(anon_class_72_17_20e643c5 *)local_88);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&f.m43);
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }